

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O3

ExternInterfaceMethodSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::ExternInterfaceMethodSyntax,slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>const&,slang::parsing::Token&,slang::parsing::Token&,slang::syntax::FunctionPrototypeSyntax&,slang::parsing::Token&>
          (BumpAllocator *this,SyntaxList<slang::syntax::AttributeInstanceSyntax> *args,
          Token *args_1,Token *args_2,FunctionPrototypeSyntax *args_3,Token *args_4)

{
  Info *pIVar1;
  Info *pIVar2;
  size_type sVar3;
  pointer ppAVar4;
  Info *pIVar5;
  SyntaxKind SVar6;
  undefined4 uVar7;
  TokenKind TVar8;
  undefined1 uVar9;
  NumericTokenFlags NVar10;
  uint32_t uVar11;
  TokenKind TVar12;
  undefined1 uVar13;
  NumericTokenFlags NVar14;
  uint32_t uVar15;
  TokenKind TVar16;
  undefined1 uVar17;
  NumericTokenFlags NVar18;
  uint32_t uVar19;
  ExternInterfaceMethodSyntax *pEVar20;
  long lVar21;
  
  pEVar20 = (ExternInterfaceMethodSyntax *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((ExternInterfaceMethodSyntax *)this->endPtr < pEVar20 + 1) {
    pEVar20 = (ExternInterfaceMethodSyntax *)allocateSlow(this,0x78,8);
  }
  else {
    this->head->current = (byte *)(pEVar20 + 1);
  }
  TVar8 = args_1->kind;
  uVar9 = args_1->field_0x2;
  NVar10.raw = (args_1->numFlags).raw;
  uVar11 = args_1->rawLen;
  pIVar1 = args_1->info;
  TVar12 = args_2->kind;
  uVar13 = args_2->field_0x2;
  NVar14.raw = (args_2->numFlags).raw;
  uVar15 = args_2->rawLen;
  pIVar2 = args_2->info;
  TVar16 = args_4->kind;
  uVar17 = args_4->field_0x2;
  NVar18.raw = (args_4->numFlags).raw;
  uVar19 = args_4->rawLen;
  pIVar5 = args_4->info;
  (pEVar20->super_MemberSyntax).super_SyntaxNode.parent = (SyntaxNode *)0x0;
  (pEVar20->super_MemberSyntax).super_SyntaxNode.kind = ExternInterfaceMethod;
  SVar6 = (args->super_SyntaxListBase).super_SyntaxNode.kind;
  uVar7 = *(undefined4 *)&(args->super_SyntaxListBase).super_SyntaxNode.field_0xc;
  (pEVar20->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.parent =
       (args->super_SyntaxListBase).super_SyntaxNode.parent;
  (pEVar20->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.kind = SVar6;
  *(undefined4 *)
   &(pEVar20->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.field_0xc = uVar7
  ;
  (pEVar20->super_MemberSyntax).attributes.super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR___cxa_pure_virtual_00507f08;
  (pEVar20->super_MemberSyntax).attributes.super_SyntaxListBase.childCount =
       (args->super_SyntaxListBase).childCount;
  sVar3 = (args->super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>).size_
  ;
  (pEVar20->super_MemberSyntax).attributes.
  super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>.data_ =
       (args->super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>).data_;
  (pEVar20->super_MemberSyntax).attributes.
  super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>.size_ = sVar3;
  (pEVar20->super_MemberSyntax).attributes.super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR_getChild_00508348;
  (pEVar20->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.parent =
       (SyntaxNode *)pEVar20;
  sVar3 = (pEVar20->super_MemberSyntax).attributes.
          super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>.size_;
  if (sVar3 != 0) {
    ppAVar4 = (pEVar20->super_MemberSyntax).attributes.
              super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>.data_;
    lVar21 = 0;
    do {
      **(undefined8 **)((long)ppAVar4 + lVar21) = pEVar20;
      lVar21 = lVar21 + 8;
    } while (sVar3 << 3 != lVar21);
  }
  (pEVar20->externKeyword).kind = TVar8;
  (pEVar20->externKeyword).field_0x2 = uVar9;
  (pEVar20->externKeyword).numFlags = (NumericTokenFlags)NVar10.raw;
  (pEVar20->externKeyword).rawLen = uVar11;
  (pEVar20->externKeyword).info = pIVar1;
  (pEVar20->forkJoin).kind = TVar12;
  (pEVar20->forkJoin).field_0x2 = uVar13;
  (pEVar20->forkJoin).numFlags = (NumericTokenFlags)NVar14.raw;
  (pEVar20->forkJoin).rawLen = uVar15;
  (pEVar20->forkJoin).info = pIVar2;
  (pEVar20->prototype).ptr = args_3;
  (pEVar20->semi).kind = TVar16;
  (pEVar20->semi).field_0x2 = uVar17;
  (pEVar20->semi).numFlags = (NumericTokenFlags)NVar18.raw;
  (pEVar20->semi).rawLen = uVar19;
  (pEVar20->semi).info = pIVar5;
  (args_3->super_SyntaxNode).parent = (SyntaxNode *)pEVar20;
  return pEVar20;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }